

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O0

int dwarf_get_LNE_name(uint val,char **s_out)

{
  char **s_out_local;
  uint val_local;
  
  if (val == 1) {
    *s_out = "DW_LNE_end_sequence";
    s_out_local._4_4_ = 0;
  }
  else if (val == 2) {
    *s_out = "DW_LNE_set_address";
    s_out_local._4_4_ = 0;
  }
  else if (val == 3) {
    *s_out = "DW_LNE_define_file";
    s_out_local._4_4_ = 0;
  }
  else if (val == 4) {
    *s_out = "DW_LNE_set_discriminator";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x11) {
    *s_out = "DW_LNE_HP_negate_is_UV_update";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x12) {
    *s_out = "DW_LNE_HP_push_context";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x13) {
    *s_out = "DW_LNE_HP_pop_context";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x14) {
    *s_out = "DW_LNE_HP_set_file_line_column";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x15) {
    *s_out = "DW_LNE_HP_set_routine_name";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x16) {
    *s_out = "DW_LNE_HP_set_sequence";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x17) {
    *s_out = "DW_LNE_HP_negate_post_semantics";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x18) {
    *s_out = "DW_LNE_HP_negate_function_exit";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x19) {
    *s_out = "DW_LNE_HP_negate_front_end_logical";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x20) {
    *s_out = "DW_LNE_HP_define_proc";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x80) {
    *s_out = "DW_LNE_HP_source_file_correlation";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xff) {
    *s_out = "DW_LNE_hi_user";
    s_out_local._4_4_ = 0;
  }
  else {
    s_out_local._4_4_ = -1;
  }
  return s_out_local._4_4_;
}

Assistant:

int
dwarf_get_LNE_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_LNE_end_sequence:
        *s_out = "DW_LNE_end_sequence";
        return DW_DLV_OK;
    case DW_LNE_set_address:
        *s_out = "DW_LNE_set_address";
        return DW_DLV_OK;
    case DW_LNE_define_file:
        *s_out = "DW_LNE_define_file";
        return DW_DLV_OK;
    case DW_LNE_set_discriminator:
        *s_out = "DW_LNE_set_discriminator";
        return DW_DLV_OK;
    case DW_LNE_HP_negate_is_UV_update:
        *s_out = "DW_LNE_HP_negate_is_UV_update";
        return DW_DLV_OK;
    case DW_LNE_HP_push_context:
        *s_out = "DW_LNE_HP_push_context";
        return DW_DLV_OK;
    case DW_LNE_HP_pop_context:
        *s_out = "DW_LNE_HP_pop_context";
        return DW_DLV_OK;
    case DW_LNE_HP_set_file_line_column:
        *s_out = "DW_LNE_HP_set_file_line_column";
        return DW_DLV_OK;
    case DW_LNE_HP_set_routine_name:
        *s_out = "DW_LNE_HP_set_routine_name";
        return DW_DLV_OK;
    case DW_LNE_HP_set_sequence:
        *s_out = "DW_LNE_HP_set_sequence";
        return DW_DLV_OK;
    case DW_LNE_HP_negate_post_semantics:
        *s_out = "DW_LNE_HP_negate_post_semantics";
        return DW_DLV_OK;
    case DW_LNE_HP_negate_function_exit:
        *s_out = "DW_LNE_HP_negate_function_exit";
        return DW_DLV_OK;
    case DW_LNE_HP_negate_front_end_logical:
        *s_out = "DW_LNE_HP_negate_front_end_logical";
        return DW_DLV_OK;
    case DW_LNE_HP_define_proc:
        *s_out = "DW_LNE_HP_define_proc";
        return DW_DLV_OK;
    case DW_LNE_HP_source_file_correlation:
        *s_out = "DW_LNE_HP_source_file_correlation";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x80. DW_LNE_lo_user */
    case DW_LNE_hi_user:
        *s_out = "DW_LNE_hi_user";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}